

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  buffer<char> *pbVar11;
  int iVar12;
  result rVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  char cVar21;
  ulong uVar22;
  uint uVar23;
  uint64_t error;
  uint64_t uVar24;
  size_t __len;
  ulong uVar25;
  boundaries bVar26;
  int exp;
  fixed_handler handler;
  uint local_84;
  ulong local_80;
  ulong local_78;
  fixed_handler local_70;
  double local_58;
  buffer<char> *local_50;
  fp local_48;
  ulong local_38;
  
  uVar15 = (ulong)(uint)precision;
  uVar20 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar20 == 0x200000000) {
      if (buf->capacity_ < uVar15) {
        (**buf->_vptr_buffer)(buf,uVar15);
      }
      buf->size_ = uVar15;
      memset(buf->ptr_,0x30,uVar15);
      return -precision;
    }
    sVar14 = buf->size_;
    uVar15 = sVar14 + 1;
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf);
      sVar14 = buf->size_;
      uVar15 = sVar14 + 1;
    }
    buf->size_ = uVar15;
    buf->ptr_[sVar14] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_84 = 0;
  if (precision < 0) {
    local_48.f = 0;
    local_48.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      local_58 = value;
      bVar26 = fp::assign_with_boundaries<double>(&local_48,value);
    }
    else {
      local_58 = value;
      bVar26 = fp::assign_float_with_boundaries<double>(&local_48,value);
    }
    if ((local_48.f & 0x10000000000000) == 0) {
      lVar19 = 0x3f;
      if ((local_48.f & 0xfffffffffffff) != 0) {
        for (; (local_48.f & 0xfffffffffffff) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      local_48.f = local_48.f << (~(byte)lVar19 + 0x35 & 0x3f);
      local_48.e = (local_48.e - ((uint)lVar19 ^ 0x3f)) + 0xb;
    }
    iVar12 = (int)((ulong)((long)(-0x32 - local_48.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar18 = iVar12 + 0x15b;
    uVar23 = iVar12 + 0x162;
    if (-1 < (int)uVar18) {
      uVar23 = uVar18;
    }
    uVar15 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar23 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_48.f << 0xb;
    local_48.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    cVar21 = (char)local_48.e;
    local_48.e = local_48.e +
                 *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar23 >> 3) * 2 + 2) +
                 0x35;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar15;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar26.lower;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar15;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar26.upper;
    lVar16 = SUB168(auVar4 * auVar8,8);
    lVar19 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
    uVar20 = lVar16 + lVar19 + 1;
    local_70.buf = buf->ptr_;
    local_70.size = 0;
    local_70._16_8_ = uVar20 - local_48.f;
    bVar17 = -(cVar21 + (char)*(short *)(basic_data<void>::pow10_exponents +
                                        (long)((int)uVar23 >> 3) * 2 + 2)) - 0x35;
    uVar24 = 1L << (bVar17 & 0x3f);
    uVar15 = uVar20 >> (bVar17 & 0x3f);
    local_80 = uVar24 - 1;
    local_84 = 1;
    uVar18 = (uint)uVar15;
    if (((((9 < uVar18) && (local_84 = 2, 99 < uVar18)) && (local_84 = 3, 999 < uVar18)) &&
        ((local_84 = 4, 9999 < uVar18 && (local_84 = 5, 99999 < uVar18)))) &&
       ((local_84 = 6, 999999 < uVar18 &&
        ((local_84 = 7, 9999999 < uVar18 && (local_84 = 8, 99999999 < uVar18)))))) {
      local_84 = 10 - (uVar18 < 1000000000);
    }
    local_78 = (ulong)((uVar23 & 0xfffffff8) + 8);
    error = ((SUB168(auVar3 * auVar7,0) >> 0x3f) - SUB168(auVar3 * auVar7,8)) + lVar16 + lVar19 + 2;
    uVar20 = uVar20 & local_80;
    local_50 = buf;
    do {
      local_84 = local_84 - 1;
      switch((ulong)local_84) {
      case 0:
        cVar21 = (char)uVar15;
        uVar15 = 0;
        goto LAB_0016fa3b;
      case 1:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10);
        iVar12 = (int)((uVar15 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar21 = (char)((uVar15 & 0xffffffff) / 100);
        iVar12 = (int)((uVar15 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar21 = (char)((uVar15 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar25 = uVar15 >> 5 & 0x7ffffff;
        cVar21 = (char)(uVar25 / 0xc35);
        iVar12 = (int)(uVar25 / 0xc35) * 100000;
        break;
      case 6:
        cVar21 = (char)((uVar15 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar21 = (char)((uVar15 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar25 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
        cVar21 = (char)(uVar25 >> 0x27);
        iVar12 = (uint)(uVar25 >> 0x27) * 1000000000;
        break;
      default:
        cVar21 = '\0';
        goto LAB_0016fa3b;
      }
      uVar15 = (ulong)(uint)((int)uVar15 - iVar12);
LAB_0016fa3b:
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_70,cVar21 + '0',
                          (&basic_data<void>::powers_of_10_64)[local_84] << (bVar17 & 0x3f),
                          ((uVar15 & 0xffffffff) << (bVar17 & 0x3f)) + uVar20,error,local_84,true);
      uVar25 = local_80;
      if (rVar13 != more) goto LAB_0016fae0;
    } while (0 < (int)local_84);
    do {
      uVar15 = uVar20 * 10;
      error = error * 10;
      uVar20 = uVar15 & uVar25;
      local_84 = local_84 - 1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_70,
                          (char)(uVar15 >> (bVar17 & 0x3f)) + '0',uVar24,uVar20,error,local_84,false
                         );
    } while (rVar13 == more);
LAB_0016fae0:
    pbVar11 = local_50;
    uVar15 = (ulong)(uint)local_70.size;
    if (rVar13 == error) {
      local_84 = local_84 + (local_70.size - (int)local_78) + 0x15b;
      fallback_format<double>(local_58,local_50,(int *)&local_84);
      return local_84;
    }
    if (local_50->capacity_ < uVar15) {
      (**local_50->_vptr_buffer)(local_50,uVar15);
    }
    pbVar11->size_ = uVar15;
    iVar12 = (int)local_78;
LAB_0016ff31:
    iVar12 = (local_84 - iVar12) + 0x15c;
  }
  else {
    if ((uint)precision < 0x12) {
      uVar15 = (ulong)value & 0xfffffffffffff;
      uVar23 = (uint)((ulong)value >> 0x34) & 0x7ff;
      if (uVar23 == 0) {
        lVar19 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        lVar16 = uVar15 << (~(byte)lVar19 + 0x35 & 0x3f);
        iVar12 = ((uint)lVar19 ^ 0xffffffc0) - 0x426;
      }
      else {
        iVar12 = uVar23 - 0x433;
        lVar16 = uVar15 + 0x10000000000000;
      }
      iVar10 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar18 = iVar10 + 0x15b;
      uVar23 = iVar10 + 0x162;
      if (-1 < (int)uVar18) {
        uVar23 = uVar18;
      }
      local_78 = (ulong)(uVar23 & 0xfffffff8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = lVar16 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar23 >> 3) * 8 + 8);
      uVar25 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      bVar17 = -((char)*(undefined2 *)
                        (basic_data<void>::pow10_exponents + (long)((int)uVar23 >> 3) * 2 + 2) +
                (char)iVar12) - 0x35;
      local_70.buf = buf->ptr_;
      local_70.size = 0;
      local_80 = 1L << (bVar17 & 0x3f);
      uVar15 = uVar25 >> (bVar17 & 0x3f);
      local_70.fixed = uVar20 == 0x200000000;
      local_70.exp10 = 0x154 - (uVar23 & 0xfffffff8);
      local_84 = 1;
      uVar23 = (uint)uVar15;
      if ((((9 < uVar23) && (local_84 = 2, 99 < uVar23)) && (local_84 = 3, 999 < uVar23)) &&
         (((local_84 = 4, 9999 < uVar23 && (local_84 = 5, 99999 < uVar23)) &&
          ((local_84 = 6, 999999 < uVar23 &&
           ((local_84 = 7, 9999999 < uVar23 && (local_84 = 8, 99999999 < uVar23)))))))) {
        local_84 = 10 - (uVar23 < 1000000000);
      }
      local_70.precision = precision;
      local_58 = value;
      local_50 = buf;
      rVar13 = fixed_handler::on_start
                         (&local_70,
                          (&basic_data<void>::powers_of_10_64)[local_84 - 1] << (bVar17 & 0x3f),
                          uVar25 / 10,10,(int *)&local_84);
      if (rVar13 == more) {
        local_38 = local_80 - 1;
        uVar25 = uVar25 & local_38;
        do {
          uVar23 = local_84 - 1;
          switch(uVar23) {
          case 0:
            cVar21 = (char)uVar15;
            uVar15 = 0;
            goto LAB_0016fdf8;
          case 1:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar22 = uVar15 >> 5 & 0x7ffffff;
            cVar21 = (char)(uVar22 / 0xc35);
            iVar12 = (int)(uVar22 / 0xc35) * 100000;
            break;
          case 6:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar22 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
            cVar21 = (char)(uVar22 >> 0x27);
            iVar12 = (uint)(uVar22 >> 0x27) * 1000000000;
            break;
          default:
            cVar21 = '\0';
            goto LAB_0016fdf8;
          }
          uVar15 = (ulong)(uint)((int)uVar15 - iVar12);
LAB_0016fdf8:
          lVar19 = (long)(int)local_84;
          local_84 = uVar23;
          rVar13 = fixed_handler::on_digit
                             (&local_70,cVar21 + '0',
                              *(long *)(
                                       "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                       + lVar19 * 8 + 0x18) << (bVar17 & 0x3f),
                              ((uVar15 & 0xffffffff) << (bVar17 & 0x3f)) + uVar25,1,uVar23,true);
          if (rVar13 != more) goto LAB_0016feab;
        } while (0 < (int)local_84);
        uVar24 = 1;
        do {
          uVar15 = uVar25 * 10;
          uVar24 = uVar24 * 10;
          uVar25 = uVar15 & local_38;
          local_84 = local_84 - 1;
          rVar13 = fixed_handler::on_digit
                             (&local_70,(char)(uVar15 >> (bVar17 & 0x3f)) + '0',local_80,uVar25,
                              uVar24,local_84,false);
        } while (rVar13 == more);
      }
LAB_0016feab:
      pbVar11 = local_50;
      uVar15 = local_78;
      buf = local_50;
      value = local_58;
      if (rVar13 != error) {
        uVar25 = (ulong)(uint)local_70.size;
        if (0 < local_70.size && uVar20 != 0x200000000) {
          uVar25 = (ulong)(uint)local_70.size;
          do {
            uVar23 = local_84 + 1;
            if (local_50->ptr_[uVar25 - 1] != '0') goto LAB_0016ff16;
            bVar1 = 1 < uVar25;
            uVar25 = uVar25 - 1;
            local_84 = uVar23;
          } while (bVar1);
          uVar25 = 0;
        }
LAB_0016ff16:
        uVar25 = uVar25 & 0xffffffff;
        if (local_50->capacity_ < uVar25) {
          (**local_50->_vptr_buffer)(local_50,uVar25);
        }
        iVar12 = (int)uVar15 + 8;
        pbVar11->size_ = uVar25;
        goto LAB_0016ff31;
      }
    }
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}